

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

void StartFloorSound(sector_t_conflict *sec)

{
  FName local_4;
  
  if ((sec->Flags & 0x40) == 0) {
    if (-1 < sec->seqType) {
      SN_StartSequence((sector_t *)sec,1,(int)sec->seqType,SEQ_PLATFORM,0,false);
      return;
    }
    if ((sec->SeqName).super_FName.Index == 0) {
      SN_StartSequence((sector_t *)sec,1,"Floor",0);
      return;
    }
    SN_StartSequence((sector_t *)sec,1,&local_4,0);
  }
  return;
}

Assistant:

static void StartFloorSound (sector_t *sec)
{
	if (sec->Flags & SECF_SILENTMOVE) return;

	if (sec->seqType >= 0)
	{
		SN_StartSequence (sec, CHAN_FLOOR, sec->seqType, SEQ_PLATFORM, 0);
	}
	else if (sec->SeqName != NAME_None)
	{
		SN_StartSequence (sec, CHAN_FLOOR, sec->SeqName, 0);
	}
	else
	{
		SN_StartSequence (sec, CHAN_FLOOR, "Floor", 0);
	}
}